

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double fppow2(int n)

{
  undefined4 local_34;
  undefined8 local_28;
  undefined8 local_20;
  double power;
  double x;
  int n_local;
  
  local_28 = 0.5;
  if (n < 0) {
    local_34 = -n;
  }
  else {
    local_28 = 2.0;
    local_34 = n;
  }
  x._4_4_ = local_34;
  local_20 = 1.0;
  while (0 < x._4_4_) {
    local_20 = local_28 * local_20;
    x._4_4_ = x._4_4_ + -1;
  }
  return local_20;
}

Assistant:

double fppow2(int n)
{
  double x, power;
  x = (n < 0) ? ((double)1.0/(double)2.0) : (double)2.0;
  n = (n < 0) ? -n : n;
  power = (double)1.0;
  while (n-- > 0)
	power *= x;
  return (power);
}